

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseStringCharRef(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  byte *pbVar1;
  byte bVar2;
  xmlChar *pxVar3;
  char *msg;
  xmlParserErrors code;
  byte *pbVar4;
  uint val;
  bool bVar5;
  
  if (str == (xmlChar **)0x0) {
    return 0;
  }
  pxVar3 = *str;
  if (pxVar3 == (xmlChar *)0x0) {
    return 0;
  }
  if ((*pxVar3 != '&') || (pxVar3[1] != '#')) {
    xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
    return 0;
  }
  bVar2 = pxVar3[2];
  if (bVar2 == 0x78) {
    pbVar4 = pxVar3 + 3;
    val = 0;
    code = XML_ERR_INVALID_HEX_CHARREF;
    while( true ) {
      bVar2 = *pbVar4;
      bVar5 = bVar2 == 0x3b;
      if (bVar5) break;
      if ((byte)(bVar2 - 0x30) < 10) {
        val = (val * 0x10 + (uint)bVar2) - 0x30;
      }
      else if ((byte)(bVar2 + 0x9f) < 6) {
        val = (val * 0x10 + (uint)bVar2) - 0x57;
      }
      else {
        if (5 < (byte)(bVar2 + 0xbf)) goto LAB_0013c2f2;
        val = (val * 0x10 + (uint)bVar2) - 0x37;
      }
      if (0x10ffff < (int)val) {
        val = 0x110000;
      }
      pbVar4 = pbVar4 + 1;
    }
  }
  else {
    pbVar4 = pxVar3 + 2;
    val = 0;
    code = XML_ERR_INVALID_DEC_CHARREF;
    while (bVar5 = bVar2 == 0x3b, !bVar5) {
      if (9 < (byte)(bVar2 - 0x30)) goto LAB_0013c2f2;
      val = ((uint)bVar2 + val * 10) - 0x30;
      if (0x10ffff < (int)val) {
        val = 0x110000;
      }
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
      bVar2 = *pbVar1;
    }
  }
LAB_0013c2ff:
  *str = pbVar4 + bVar5;
  if ((int)val < 0x110000) {
    if ((int)val < 0x100) {
      if (0x1f < (int)val) {
        return val;
      }
      if ((val < 0xe) && ((0x2600U >> (val & 0x1f) & 1) != 0)) {
        return val;
      }
    }
    else if (val - 0x10000 < 0xffffd800 || val - 0xe000 < 0x1ffe) {
      return val;
    }
    msg = "xmlParseStringCharRef: invalid xmlChar value %d\n";
  }
  else {
    msg = "xmlParseStringCharRef: character reference out of bounds\n";
  }
  xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,msg,val);
  return 0;
LAB_0013c2f2:
  val = 0;
  xmlFatalErr(ctxt,code,(char *)0x0);
  goto LAB_0013c2ff;
}

Assistant:

static int
xmlParseStringCharRef(xmlParserCtxtPtr ctxt, const xmlChar **str) {
    const xmlChar *ptr;
    xmlChar cur;
    int val = 0;

    if ((str == NULL) || (*str == NULL)) return(0);
    ptr = *str;
    cur = *ptr;
    if ((cur == '&') && (ptr[1] == '#') && (ptr[2] == 'x')) {
	ptr += 3;
	cur = *ptr;
	while (cur != ';') { /* Non input consuming loop */
	    if ((cur >= '0') && (cur <= '9'))
	        val = val * 16 + (cur - '0');
	    else if ((cur >= 'a') && (cur <= 'f'))
	        val = val * 16 + (cur - 'a') + 10;
	    else if ((cur >= 'A') && (cur <= 'F'))
	        val = val * 16 + (cur - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    ptr++;
	    cur = *ptr;
	}
	if (cur == ';')
	    ptr++;
    } else if  ((cur == '&') && (ptr[1] == '#')){
	ptr += 2;
	cur = *ptr;
	while (cur != ';') { /* Non input consuming loops */
	    if ((cur >= '0') && (cur <= '9'))
	        val = val * 10 + (cur - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    ptr++;
	    cur = *ptr;
	}
	if (cur == ';')
	    ptr++;
    } else {
	xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
	return(0);
    }
    *str = ptr;

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseStringCharRef: character reference out of bounds\n",
                val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
			  "xmlParseStringCharRef: invalid xmlChar value %d\n",
			  val);
    }
    return(0);
}